

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb18030.c
# Opt level: O3

int gb18030_code_to_mbclen(OnigCodePoint code)

{
  int iVar1;
  
  if (code < 0x1000000) {
    iVar1 = -400;
    if (code < 0x10000) {
      if (code < 0x100) {
        if (0x7d < (ulong)code - 0x81) {
          return 1;
        }
      }
      else if ((ulong)(code >> 8) - 0x81 < 0x7e) {
        if (0xffffffffffffff81 < ((ulong)code & 0xff) - 0xff) {
          return 2;
        }
        if (""[(ulong)code & 0xff] == '\x01') {
          return 2;
        }
      }
      return -400;
    }
  }
  else {
    if (0x7d < (ulong)(code >> 0x18) - 0x81) {
      return -400;
    }
    iVar1 = 4;
    if (9 < (ulong)(code >> 0x10 & 0xfe) - 0x30) {
      return -400;
    }
  }
  return iVar1;
}

Assistant:

static int
gb18030_code_to_mbclen(OnigCodePoint code)
{
  if ((code & 0xff000000) != 0) {
    if (GB18030_MAP[(int )(code >> 24) & 0xff] == CM)
      if (GB18030_MAP[(int )(code >> 16) & 0xff] == C4)
        return 4;
  }
  else if ((code & 0xff0000) != 0) return ONIGERR_INVALID_CODE_POINT_VALUE;
  else if ((code & 0xff00) != 0) {
    if (GB18030_MAP[(int )(code >> 8) & 0xff] == CM) {
      char c = GB18030_MAP[(int )code & 0xff];
      if (c == CM || c == C2)
        return 2;
    }
  }
  else {
    if (GB18030_MAP[(int )(code & 0xff)] != CM)
      return 1;
  }

  return ONIGERR_INVALID_CODE_POINT_VALUE;
}